

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Uart61.cpp
# Opt level: O0

int IMU_JY61::uart_set(int fd,int nSpeed,int nBits,char nEvent,int nStop)

{
  int iVar1;
  uint uVar2;
  undefined1 local_98 [8];
  termios oldtio;
  termios newtio;
  int nStop_local;
  char nEvent_local;
  int nBits_local;
  int nSpeed_local;
  int fd_local;
  
  iVar1 = tcgetattr(fd,(termios *)local_98);
  if (iVar1 != 0) {
    perror("SetupSerial 1");
    uVar2 = tcgetattr(fd,(termios *)local_98);
    printf("tcgetattr( fd,&oldtio) -> %d\n",(ulong)uVar2);
    return -1;
  }
  bzero(&oldtio.c_ispeed,0x3c);
  if (nEvent == 'E') {
LAB_00104f8d:
    oldtio.c_ispeed = oldtio.c_ispeed | 0x30;
  }
  else {
    if (nEvent == 'N') goto LAB_00104fbd;
    if (nEvent != 'O') {
      if (nEvent == 'e') goto LAB_00104f8d;
      if ((nEvent == 'n') || (nEvent != 'o')) goto LAB_00104fbd;
    }
    oldtio.c_ispeed = oldtio.c_ispeed | 0x30;
  }
LAB_00104fbd:
  if (nSpeed == 0x960) {
    cfsetispeed((termios *)&oldtio.c_ispeed,0xb);
    cfsetospeed((termios *)&oldtio.c_ispeed,0xb);
  }
  else if (nSpeed == 0x12c0) {
    cfsetispeed((termios *)&oldtio.c_ispeed,0xc);
    cfsetospeed((termios *)&oldtio.c_ispeed,0xc);
  }
  else if (nSpeed == 0x2580) {
    cfsetispeed((termios *)&oldtio.c_ispeed,0xd);
    cfsetospeed((termios *)&oldtio.c_ispeed,0xd);
  }
  else if (nSpeed == 0x1c200) {
    cfsetispeed((termios *)&oldtio.c_ispeed,0x1002);
    cfsetospeed((termios *)&oldtio.c_ispeed,0x1002);
  }
  else if (nSpeed == 0x70800) {
    cfsetispeed((termios *)&oldtio.c_ispeed,0x1004);
    cfsetospeed((termios *)&oldtio.c_ispeed,0x1004);
  }
  else {
    cfsetispeed((termios *)&oldtio.c_ispeed,0xd);
    cfsetospeed((termios *)&oldtio.c_ispeed,0xd);
  }
  tcflush(fd,0);
  iVar1 = tcsetattr(fd,0,(termios *)&oldtio.c_ispeed);
  if (iVar1 == 0) {
    printf("set done!\n");
    nSpeed_local = 0;
  }
  else {
    perror("com set error");
    nSpeed_local = -1;
  }
  return nSpeed_local;
}

Assistant:

int uart_set(int fd,int nSpeed, int nBits, char nEvent, int nStop)
    {
        struct termios newtio,oldtio;
        if  ( tcgetattr( fd,&oldtio)  !=  0) {
            perror("SetupSerial 1");
            printf("tcgetattr( fd,&oldtio) -> %d\n",tcgetattr( fd,&oldtio));
            return -1;
        }
        bzero( &newtio, sizeof( newtio ) );
        newtio.c_cflag  |=  CLOCAL | CREAD;
        newtio.c_cflag &= ~CSIZE;
        switch( nBits )
        {
            case 7:
                newtio.c_cflag |= CS7;
                break;
            case 8:
                newtio.c_cflag |= CS8;
                break;
        }
        switch( nEvent )
        {
            case 'o':
            case 'O':
                newtio.c_cflag |= PARENB;
                newtio.c_cflag |= PARODD;
                newtio.c_iflag |= (INPCK | ISTRIP);
                break;
            case 'e':
            case 'E':
                newtio.c_iflag |= (INPCK | ISTRIP);
                newtio.c_cflag |= PARENB;
                newtio.c_cflag &= ~PARODD;
                break;
            case 'n':
            case 'N':
                newtio.c_cflag &= ~PARENB;
                break;
            default:
                break;
        }

        /*设置波特率*/

        switch( nSpeed )
        {
            case 2400:
                cfsetispeed(&newtio, B2400);
                cfsetospeed(&newtio, B2400);
                break;
            case 4800:
                cfsetispeed(&newtio, B4800);
                cfsetospeed(&newtio, B4800);
                break;
            case 9600:
                cfsetispeed(&newtio, B9600);
                cfsetospeed(&newtio, B9600);
                break;
            case 115200:
                cfsetispeed(&newtio, B115200);
                cfsetospeed(&newtio, B115200);
                break;
            case 460800:
                cfsetispeed(&newtio, B460800);
                cfsetospeed(&newtio, B460800);
                break;
            default:
                cfsetispeed(&newtio, B9600);
                cfsetospeed(&newtio, B9600);
                break;
        }
        if( nStop == 1 )
            newtio.c_cflag &=  ~CSTOPB;
        else if ( nStop == 2 )
            newtio.c_cflag |=  CSTOPB;
        newtio.c_cc[VTIME]  = 0;
        newtio.c_cc[VMIN] = 0;
        tcflush(fd,TCIFLUSH);

        if((tcsetattr(fd,TCSANOW,&newtio))!=0)
        {
            perror("com set error");
            return -1;
        }
        printf("set done!\n");
        return 0;
    }